

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

void * pthNotifyThread(void *x)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int __fd;
  evtCallback_t *peVar8;
  callback_t *pcVar9;
  bool bVar10;
  gpioReport_t report [4096];
  undefined8 local_c038;
  uint local_c030 [12288];
  
  uVar2 = *x;
  free(x);
  __fd = gPigNotify[(int)uVar2];
  uVar6 = (ulong)pthNotifyThread::got;
  while( true ) {
    uVar6 = read(__fd,(void *)((long)local_c030 + (uVar6 - 8)),0xc000 - uVar6);
    if ((int)uVar6 < 1) break;
    pthNotifyThread::got = (int)uVar6 + pthNotifyThread::got;
    if (0xb < (uint)pthNotifyThread::got) {
      uVar6 = 0;
      do {
        uVar1 = *(ushort *)((long)local_c030 + uVar6 * 0xc + -6);
        if (uVar1 == 0) {
          uVar7 = local_c030[uVar6 * 3];
          uVar3 = gLastLevel[(int)uVar2];
          uVar4 = gNotifyBits[(int)uVar2];
          gLastLevel[(int)uVar2] = uVar7;
          for (pcVar9 = gCallBackFirst; pcVar9 != (callback_t *)0x0; pcVar9 = pcVar9->next) {
            if (pcVar9->pi == uVar2) {
              uVar5 = pcVar9->gpio;
              if (((((uVar3 ^ uVar7) & uVar4) >> (uVar5 & 0x1f) & 1) != 0) &&
                 (bVar10 = (uVar7 >> (uVar5 & 0x1f) & 1) != 0, pcVar9->edge != (uint)bVar10)) {
                if (pcVar9->ex == 0) {
                  (*pcVar9->f)((ulong)uVar2,(ulong)uVar5,(ulong)bVar10,
                               (ulong)local_c030[uVar6 * 3 + -1]);
                }
                else {
                  (*pcVar9->f)((ulong)uVar2);
                }
              }
            }
          }
        }
        else if ((uVar1 & 0x20) == 0) {
          if (((char)uVar1 < '\0') && (geCallBackFirst != (evtCallback_t *)0x0)) {
            uVar7 = uVar1 & 0x1f;
            peVar8 = geCallBackFirst;
            do {
              if ((peVar8->pi == uVar2) && (peVar8->event == uVar7)) {
                if (peVar8->ex == 0) {
                  (*peVar8->f)((ulong)uVar2,(ulong)uVar7,(ulong)local_c030[uVar6 * 3 + -1]);
                }
                else {
                  (*peVar8->f)((ulong)uVar2,(ulong)uVar7,(ulong)local_c030[uVar6 * 3 + -1],
                               peVar8->user);
                }
              }
              peVar8 = peVar8->next;
            } while (peVar8 != (evtCallback_t *)0x0);
          }
        }
        else if (gCallBackFirst != (callback_t *)0x0) {
          uVar7 = uVar1 & 0x1f;
          pcVar9 = gCallBackFirst;
          do {
            if ((pcVar9->pi == uVar2) && (pcVar9->gpio == uVar7)) {
              if (pcVar9->ex == 0) {
                (*pcVar9->f)((ulong)uVar2,(ulong)uVar7,2,(ulong)local_c030[uVar6 * 3 + -1]);
              }
              else {
                (*pcVar9->f)((ulong)uVar2,(ulong)uVar7,2,(ulong)local_c030[uVar6 * 3 + -1],
                             pcVar9->user);
              }
            }
            pcVar9 = pcVar9->next;
          } while (pcVar9 != (callback_t *)0x0);
        }
        uVar6 = uVar6 + 1;
        pthNotifyThread::got = pthNotifyThread::got - 0xc;
      } while (0xb < (uint)pthNotifyThread::got);
      if (pthNotifyThread::got != 0) {
        local_c030[0] = local_c030[(uVar6 & 0xffffffff) * 3];
        local_c038 = *(undefined8 *)(local_c030 + (uVar6 & 0xffffffff) * 3 + -2);
      }
    }
    __fd = gPigNotify[(int)uVar2];
    uVar6 = (ulong)(uint)pthNotifyThread::got;
  }
  fprintf(_stderr,"notify thread for pi %d broke with read error %d\n",(ulong)uVar2,
          uVar6 & 0xffffffff);
  do {
    sleep(1);
  } while( true );
}

Assistant:

static void *pthNotifyThread(void *x)
{
   static int got = 0;
   int pi;
   int bytes, r;
   gpioReport_t report[PI_MAX_REPORTS_PER_READ];

   pi = *((int*)x);
   free(x); /* memory allocated in pigpio_start */

   while (1)
   {
      bytes = read(gPigNotify[pi], (char*)&report+got, sizeof(report)-got);

      if (bytes > 0) got += bytes;
      else break;

      r = 0;

      while (got >= sizeof(gpioReport_t))
      {
         dispatch_notification(pi, &report[r]);

         r++;

         got -= sizeof(gpioReport_t);
      }

      /* copy any partial report to start of array */
      
      if (got && r) report[0] = report[r];
   }

   fprintf(stderr, "notify thread for pi %d broke with read error %d\n",
      pi, bytes);

   while (1) sleep(1);

   return NULL;
}